

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetAllBorderRouters
          (Registry *this,BorderRouterArray *aRet)

{
  PersistentStorage *pPVar1;
  Status SVar2;
  int iVar3;
  BorderRouter local_1a0;
  BorderRouterArray *local_18;
  BorderRouterArray *aRet_local;
  Registry *this_local;
  
  pPVar1 = this->mStorage;
  local_18 = aRet;
  aRet_local = (BorderRouterArray *)this;
  BorderRouter::BorderRouter(&local_1a0);
  iVar3 = (*pPVar1->_vptr_PersistentStorage[0x17])(pPVar1,&local_1a0,local_18);
  SVar2 = anon_unknown_0::MapStatus((Status)iVar3);
  BorderRouter::~BorderRouter(&local_1a0);
  return SVar2;
}

Assistant:

Registry::Status Registry::GetAllBorderRouters(BorderRouterArray &aRet)
{
    return MapStatus(mStorage->Lookup(BorderRouter{}, aRet));
}